

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O1

void greetable_skeleton_finalize(GObject *object)

{
  GType GVar1;
  long lVar2;
  
  GVar1 = greetable_skeleton_get_type();
  lVar2 = g_type_check_instance_cast(object,GVar1);
  g_value_unset(**(undefined8 **)(lVar2 + 0x20));
  g_free(**(undefined8 **)(lVar2 + 0x20));
  g_list_free_full(*(undefined8 *)(*(long *)(lVar2 + 0x20) + 8),_changed_property_free);
  if (*(long *)(*(long *)(lVar2 + 0x20) + 0x10) != 0) {
    g_source_destroy();
  }
  g_main_context_unref(*(undefined8 *)(*(long *)(lVar2 + 0x20) + 0x18));
  g_mutex_clear(*(long *)(lVar2 + 0x20) + 0x20);
  lVar2 = g_type_check_class_cast(greetable_skeleton_parent_class,0x50);
  (**(code **)(lVar2 + 0x30))(object);
  return;
}

Assistant:

static void
greetable_skeleton_finalize (GObject *object)
{
  GreetableSkeleton *skeleton = GREETABLE_SKELETON (object);
  guint n;
  for (n = 0; n < 1; n++)
    g_value_unset (&skeleton->priv->properties[n]);
  g_free (skeleton->priv->properties);
  g_list_free_full (skeleton->priv->changed_properties, (GDestroyNotify) _changed_property_free);
  if (skeleton->priv->changed_properties_idle_source != NULL)
    g_source_destroy (skeleton->priv->changed_properties_idle_source);
  g_main_context_unref (skeleton->priv->context);
  g_mutex_clear (&skeleton->priv->lock);
  G_OBJECT_CLASS (greetable_skeleton_parent_class)->finalize (object);
}